

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPoolTest.cpp
# Opt level: O2

int main(void)

{
  undefined1 local_128 [8];
  ThreadPool pool;
  undefined1 local_50 [24];
  code *local_38;
  allocator<char> local_29;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"TestThread",&local_29);
  pool._176_8_ = Foo;
  higan::Thread::Thread((Thread *)local_128,(string *)local_50,(ThreadFunc *)&pool.running_);
  std::_Function_base::~_Function_base((_Function_base *)&pool.running_);
  std::__cxx11::string::~string((string *)local_50);
  higan::Thread::Start((Thread *)local_128);
  higan::Thread::~Thread((Thread *)local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"TestThreadPool",(allocator<char> *)&pool.running_);
  higan::ThreadPool::ThreadPool((ThreadPool *)local_128,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  higan::ThreadPool::Init((ThreadPool *)local_128,2);
  local_50._8_8_ = 0;
  local_50._0_8_ = Foo;
  local_38 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_50._16_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  higan::ThreadPool::CallFunction((ThreadPool *)local_128,(ThreadFunc *)local_50);
  std::_Function_base::~_Function_base((_Function_base *)local_50);
  local_50._8_8_ = 0;
  local_50._0_8_ = Foo;
  local_38 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_50._16_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  higan::ThreadPool::CallFunction((ThreadPool *)local_128,(ThreadFunc *)local_50);
  std::_Function_base::~_Function_base((_Function_base *)local_50);
  local_50._8_8_ = 0;
  local_50._0_8_ = Foo;
  local_38 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_50._16_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  higan::ThreadPool::CallFunction((ThreadPool *)local_128,(ThreadFunc *)local_50);
  std::_Function_base::~_Function_base((_Function_base *)local_50);
  local_50._8_8_ = 0;
  local_50._0_8_ = Foo;
  local_38 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_50._16_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  higan::ThreadPool::CallFunction((ThreadPool *)local_128,(ThreadFunc *)local_50);
  std::_Function_base::~_Function_base((_Function_base *)local_50);
  local_50._8_8_ = 0;
  local_50._0_8_ = Foo;
  local_38 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_50._16_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  higan::ThreadPool::CallFunction((ThreadPool *)local_128,(ThreadFunc *)local_50);
  std::_Function_base::~_Function_base((_Function_base *)local_50);
  local_50._8_8_ = 0;
  local_50._0_8_ = Foo;
  local_38 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_50._16_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  higan::ThreadPool::CallFunction((ThreadPool *)local_128,(ThreadFunc *)local_50);
  std::_Function_base::~_Function_base((_Function_base *)local_50);
  local_50._8_8_ = 0;
  local_50._0_8_ = Foo;
  local_38 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_50._16_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  higan::ThreadPool::CallFunction((ThreadPool *)local_128,(ThreadFunc *)local_50);
  std::_Function_base::~_Function_base((_Function_base *)local_50);
  sleep(1);
  higan::ThreadPool::~ThreadPool((ThreadPool *)local_128);
  return 0;
}

Assistant:

int main()
{

	{
		/**
		 * 测试detach 未被Join线程
		 */
		higan::Thread thread("TestThread", Foo);
		thread.Start();
	}


	higan::ThreadPool pool("TestThreadPool");
	pool.Init(2);

	pool.CallFunction(Foo);
	pool.CallFunction(Foo);
	pool.CallFunction(Foo);
	pool.CallFunction(Foo);
	pool.CallFunction(Foo);
	pool.CallFunction(Foo);
	pool.CallFunction(Foo);

	sleep(1);

	return 0;
}